

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O0

bool __thiscall
cmFileCommand::HandleDifferentCommand
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  cmMakefile *this_00;
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  ostream *poVar4;
  char *local_318;
  allocator<char> local_2b1;
  string local_2b0;
  allocator<char> local_289;
  string local_288;
  allocator<char> local_261;
  string local_260;
  char *local_240;
  char *result;
  string local_230;
  allocator<char> local_209;
  string local_208;
  string local_1e8;
  ostringstream local_1b8 [8];
  ostringstream e;
  uint local_40;
  int local_3c;
  uint i;
  Doing doing;
  char *var;
  char *file_rhs;
  char *file_lhs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmFileCommand *this_local;
  
  file_rhs = (char *)0x0;
  var = (char *)0x0;
  _i = (char *)0x0;
  local_3c = 1;
  local_40 = 1;
  do {
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(args);
    if (sVar2 <= local_40) {
      if (_i == (char *)0x0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_208,"DIFFERENT not given result variable name.",&local_209);
        cmCommand::SetError(&this->super_cmCommand,&local_208);
        std::__cxx11::string::~string((string *)&local_208);
        std::allocator<char>::~allocator(&local_209);
        this_local._7_1_ = false;
      }
      else if ((file_rhs == (char *)0x0) || (var == (char *)0x0)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_230,"DIFFERENT not given FILES option with two file names.",
                   (allocator<char> *)((long)&result + 7));
        cmCommand::SetError(&this->super_cmCommand,&local_230);
        std::__cxx11::string::~string((string *)&local_230);
        std::allocator<char>::~allocator((allocator<char> *)((long)&result + 7));
        this_local._7_1_ = false;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_260,file_rhs,&local_261)
        ;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_288,var,&local_289);
        bVar1 = cmsys::SystemTools::FilesDiffer(&local_260,&local_288);
        if (bVar1) {
          local_318 = "1";
        }
        else {
          local_318 = "0";
        }
        std::__cxx11::string::~string((string *)&local_288);
        std::allocator<char>::~allocator(&local_289);
        std::__cxx11::string::~string((string *)&local_260);
        std::allocator<char>::~allocator(&local_261);
        local_240 = local_318;
        this_00 = (this->super_cmCommand).Makefile;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b0,_i,&local_2b1);
        cmMakefile::AddDefinition(this_00,&local_2b0,local_240);
        std::__cxx11::string::~string((string *)&local_2b0);
        std::allocator<char>::~allocator(&local_2b1);
        this_local._7_1_ = true;
      }
      return this_local._7_1_;
    }
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](args,(ulong)local_40);
    bVar1 = std::operator==(pvVar3,"FILES");
    if (bVar1) {
      local_3c = 2;
    }
    else if (local_3c == 1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](args,(ulong)local_40);
      _i = (char *)std::__cxx11::string::c_str();
      local_3c = 0;
    }
    else if (local_3c == 2) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](args,(ulong)local_40);
      file_rhs = (char *)std::__cxx11::string::c_str();
      local_3c = 3;
    }
    else {
      if (local_3c != 3) {
        std::__cxx11::ostringstream::ostringstream(local_1b8);
        poVar4 = std::operator<<((ostream *)local_1b8,"DIFFERENT given unknown argument ");
        pvVar3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](args,(ulong)local_40);
        std::operator<<(poVar4,(string *)pvVar3);
        std::__cxx11::ostringstream::str();
        cmCommand::SetError(&this->super_cmCommand,&local_1e8);
        std::__cxx11::string::~string((string *)&local_1e8);
        std::__cxx11::ostringstream::~ostringstream(local_1b8);
        return false;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](args,(ulong)local_40);
      var = (char *)std::__cxx11::string::c_str();
      local_3c = 0;
    }
    local_40 = local_40 + 1;
  } while( true );
}

Assistant:

bool cmFileCommand::HandleDifferentCommand(
  std::vector<std::string> const& args)
{
  /*
    FILE(DIFFERENT <variable> FILES <lhs> <rhs>)
   */

  // Evaluate arguments.
  const char* file_lhs = nullptr;
  const char* file_rhs = nullptr;
  const char* var = nullptr;
  enum Doing
  {
    DoingNone,
    DoingVar,
    DoingFileLHS,
    DoingFileRHS
  };
  Doing doing = DoingVar;
  for (unsigned int i = 1; i < args.size(); ++i) {
    if (args[i] == "FILES") {
      doing = DoingFileLHS;
    } else if (doing == DoingVar) {
      var = args[i].c_str();
      doing = DoingNone;
    } else if (doing == DoingFileLHS) {
      file_lhs = args[i].c_str();
      doing = DoingFileRHS;
    } else if (doing == DoingFileRHS) {
      file_rhs = args[i].c_str();
      doing = DoingNone;
    } else {
      std::ostringstream e;
      e << "DIFFERENT given unknown argument " << args[i];
      this->SetError(e.str());
      return false;
    }
  }
  if (!var) {
    this->SetError("DIFFERENT not given result variable name.");
    return false;
  }
  if (!file_lhs || !file_rhs) {
    this->SetError("DIFFERENT not given FILES option with two file names.");
    return false;
  }

  // Compare the files.
  const char* result =
    cmSystemTools::FilesDiffer(file_lhs, file_rhs) ? "1" : "0";
  this->Makefile->AddDefinition(var, result);
  return true;
}